

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O1

void nn_btcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  int iVar1;
  ulong extraout_RAX;
  nn_list_item *it;
  nn_list_item *pnVar2;
  nn_atcp *self_01;
  
  if (type == -3 && src == -2) goto LAB_001367b6;
  while( true ) {
    if ((*(int *)&self[1].ctx == 3) && (nn_btcp_shutdown_cold_2(), (extraout_RAX & 1) != 0)) {
      return;
    }
    iVar1 = *(int *)&self[1].ctx;
    if (iVar1 == 4) break;
    if (iVar1 == 5) {
      if ((src != 2) || (type != 0x85b9)) {
        nn_btcp_shutdown_cold_3();
      }
      nn_list_erase((nn_list *)&self[8].stopped.src,(nn_list_item *)((long)srcptr + 0x720));
      nn_atcp_term((nn_atcp *)srcptr);
      nn_free(srcptr);
LAB_00136862:
      iVar1 = nn_list_empty((nn_list *)&self[8].stopped.src);
      if (iVar1 == 0) {
        return;
      }
      *(undefined4 *)&self[1].ctx = 1;
      nn_fsm_stopped_noevent(self);
      nn_ep_stopped((nn_ep *)self[1].stopped.fsm);
      return;
    }
    nn_btcp_shutdown_cold_4();
LAB_001367b6:
    nn_btcp_shutdown_cold_1();
  }
  iVar1 = nn_usock_isidle((nn_usock *)&self[1].stopped.src);
  if (iVar1 == 0) {
    return;
  }
  self_00 = &self[8].stopped.src;
  for (it = nn_list_begin((nn_list *)self_00); pnVar2 = nn_list_end((nn_list *)self_00),
      it != pnVar2; it = nn_list_next((nn_list *)self_00,it)) {
    self_01 = (nn_atcp *)(it + -0x72);
    if (it == (nn_list_item *)0x0) {
      self_01 = (nn_atcp *)0x0;
    }
    nn_atcp_stop(self_01);
  }
  *(undefined4 *)&self[1].ctx = 5;
  goto LAB_00136862;
}

Assistant:

static void nn_btcp_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_list_item *it;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (btcp->atcp) {
            nn_atcp_stop (btcp->atcp);
            btcp->state = NN_BTCP_STATE_STOPPING_ATCP;
        }
        else {
            btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
        }
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCP)) {
        if (!nn_atcp_isidle (btcp->atcp))
            return;
        nn_atcp_term (btcp->atcp);
        nn_free (btcp->atcp);
        btcp->atcp = NULL;
        nn_usock_stop (&btcp->usock);
        btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_USOCK)) {
       if (!nn_usock_isidle (&btcp->usock))
            return;
        for (it = nn_list_begin (&btcp->atcps);
              it != nn_list_end (&btcp->atcps);
              it = nn_list_next (&btcp->atcps, it)) {
            atcp = nn_cont (it, struct nn_atcp, item);
            nn_atcp_stop (atcp);
        }
        btcp->state = NN_BTCP_STATE_STOPPING_ATCPS;
        goto atcps_stopping;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCPS)) {
        nn_assert (src == NN_BTCP_SRC_ATCP && type == NN_ATCP_STOPPED);
        atcp = (struct nn_atcp *) srcptr;
        nn_list_erase (&btcp->atcps, &atcp->item);
        nn_atcp_term (atcp);
        nn_free (atcp);

        /*  If there are no more atcp state machines, we can stop the whole
            btcp object. */
atcps_stopping:
        if (nn_list_empty (&btcp->atcps)) {
            btcp->state = NN_BTCP_STATE_IDLE;
            nn_fsm_stopped_noevent (&btcp->fsm);
            nn_ep_stopped (btcp->ep);
            return;
        }

        return;
    }

    nn_fsm_bad_action(btcp->state, src, type);
}